

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSerializeEngine.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XSerializeEngine::XSerializeEngine
          (XSerializeEngine *this,BinInputStream *inStream,XMLGrammarPool *gramPool,
          XMLSize_t bufSize)

{
  MemoryManager *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  ValueVectorOf<void_*> *pVVar4;
  undefined4 extraout_var_00;
  XMLByte *pXVar3;
  
  this->fStoreLoad = 1;
  this->fStorerLevel = 0;
  this->fGrammarPool = gramPool;
  this->fInputStream = inStream;
  this->fOutputStream = (BinOutputStream *)0x0;
  this->fBufCount = 0;
  this->fBufSize = bufSize;
  iVar2 = (*gramPool->fMemMgr->_vptr_MemoryManager[3])(gramPool->fMemMgr,bufSize);
  pXVar3 = (XMLByte *)CONCAT44(extraout_var,iVar2);
  this->fBufStart = pXVar3;
  this->fBufEnd = (XMLByte *)0x0;
  this->fBufCur = pXVar3;
  this->fBufLoadMax = pXVar3;
  this->fStorePool = (RefHashTableOf<xercesc_4_0::XSerializedObjectId,_xercesc_4_0::PtrHasher> *)0x0
  ;
  pVVar4 = (ValueVectorOf<void_*> *)XMemory::operator_new(0x28,gramPool->fMemMgr);
  pMVar1 = gramPool->fMemMgr;
  pVVar4->fCallDestructor = false;
  pVVar4->fCurCount = 0;
  pVVar4->fMaxCount = 0x1d;
  pVVar4->fElemList = (void **)0x0;
  pVVar4->fMemoryManager = pMVar1;
  iVar2 = (*pMVar1->_vptr_MemoryManager[3])();
  pVVar4->fElemList = (void **)CONCAT44(extraout_var_00,iVar2);
  memset((void **)CONCAT44(extraout_var_00,iVar2),0,pVVar4->fMaxCount << 3);
  this->fLoadPool = pVVar4;
  this->fObjectCount = 0;
  fillBuffer(this);
  return;
}

Assistant:

XSerializeEngine::XSerializeEngine(BinInputStream*         inStream
                                 , XMLGrammarPool* const   gramPool
                                 , XMLSize_t               bufSize)
:fStoreLoad(mode_Load)
,fStorerLevel(0)
,fGrammarPool(gramPool)
,fInputStream(inStream)
,fOutputStream(0)
,fBufCount(0)
,fBufSize(bufSize)
,fBufStart( (XMLByte*) gramPool->getMemoryManager()->allocate(bufSize))
,fBufEnd(0)
,fBufCur(fBufStart)
,fBufLoadMax(fBufStart)
,fStorePool(0)
,fLoadPool( new (gramPool->getMemoryManager()) ValueVectorOf<void*>(29, gramPool->getMemoryManager(), false))
,fObjectCount(0)
{
    /***
     *  initialize buffer from the inStream
     ***/
    fillBuffer();

}